

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O0

int __thiscall
asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::listen
          (basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *this,int __fd,int __n)

{
  int extraout_EAX;
  service_type *psVar1;
  implementation_type *piVar2;
  error_code ec;
  char *in_stack_ffffffffffffffb8;
  
  CLI::std::error_code::error_code((error_code *)this);
  psVar1 = asio::detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
           ::get_service(&this->impl_);
  piVar2 = asio::detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
           ::get_implementation(&this->impl_);
  asio::detail::reactive_socket_service_base::listen
            (&psVar1->super_reactive_socket_service_base,(int)piVar2,__fd);
  asio::detail::throw_error((error_code *)this,in_stack_ffffffffffffffb8);
  return extraout_EAX;
}

Assistant:

void listen(int backlog = socket_base::max_listen_connections)
  {
    asio::error_code ec;
    impl_.get_service().listen(impl_.get_implementation(), backlog, ec);
    asio::detail::throw_error(ec, "listen");
  }